

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O0

UniquePtr<SSLAEADContext>
bssl::SSLAEADContext::Create
          (evp_aead_direction_t direction,uint16_t version,SSL_CIPHER *cipher,
          Span<const_unsigned_char> enc_key,Span<const_unsigned_char> mac_key,
          Span<const_unsigned_char> fixed_iv)

{
  bool bVar1;
  int iVar2;
  __uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true> _Var3;
  size_t sVar4;
  pointer pSVar5;
  size_t sVar6;
  size_t sVar7;
  uchar *puVar8;
  evp_aead_ctx_st *ctx;
  undefined6 in_register_00000032;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true> this;
  uchar *in_R9;
  Span<unsigned_char> local_f8;
  uchar *local_e8;
  uchar *local_e0;
  uchar *local_d8;
  size_t sStack_d0;
  uchar local_b8 [8];
  uint8_t merged_key [80];
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_58;
  UniquePtr<SSLAEADContext> aead_ctx;
  size_t expected_fixed_iv_len;
  size_t expected_mac_key_len;
  EVP_AEAD *pEStack_38;
  uint16_t protocol_version;
  EVP_AEAD *aead;
  SSL_CIPHER *cipher_local;
  undefined1 auStack_20 [2];
  uint16_t version_local;
  evp_aead_direction_t direction_local;
  Span<const_unsigned_char> enc_key_local;
  
  this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._0_4_ = direction;
  _auStack_20 = (uchar *)enc_key.size_;
  aead = (EVP_AEAD *)enc_key.data_;
  cipher_local._2_2_ = (uint16_t)cipher;
  cipher_local._4_4_ = (evp_aead_direction_t)CONCAT62(in_register_00000032,version);
  enc_key_local.data_ = in_R9;
  enc_key_local.size_ =
       (size_t)this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
  bVar1 = ssl_protocol_version_from_wire
                    ((uint16_t *)((long)&expected_mac_key_len + 6),cipher_local._2_2_);
  if ((((bVar1) &&
       (bVar1 = ssl_cipher_get_evp_aead
                          (&stack0xffffffffffffffc8,&expected_fixed_iv_len,(size_t *)&aead_ctx,
                           (SSL_CIPHER *)aead,expected_mac_key_len._6_2_), bVar1)) &&
      (_Var3.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
            (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)
            Span<const_unsigned_char>::size(&fixed_iv),
      (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)
      aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl ==
      _Var3.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)) &&
     (sVar4 = Span<const_unsigned_char>::size(&mac_key), expected_fixed_iv_len == sVar4)) {
    MakeUnique<bssl::SSLAEADContext,ssl_cipher_st_const*&>
              ((bssl *)&local_58,(ssl_cipher_st **)&aead);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
    if (bVar1) {
      sVar4 = EVP_AEAD_nonce_length(pEStack_38);
      if (0x20 < sVar4) {
        __assert_fail("EVP_AEAD_nonce_length(aead) <= EVP_AEAD_MAX_NONCE_LENGTH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x44,
                      "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                     );
      }
      sVar4 = EVP_AEAD_nonce_length(pEStack_38);
      pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->(&local_58)
      ;
      pSVar5->variable_nonce_len_ = (uint8_t)sVar4;
      bVar1 = Span<const_unsigned_char>::empty(&mac_key);
      if (bVar1) {
        pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&local_58);
        local_d8 = fixed_iv.data_;
        sStack_d0 = fixed_iv.size_;
        InplaceVector<unsigned_char,_32UL>::CopyFrom(&pSVar5->fixed_nonce_,fixed_iv);
        if ((expected_mac_key_len._6_2_ < 0x304) && (((ulong)aead->cleanup & 0x2000000000) == 0)) {
          sVar4 = Span<const_unsigned_char>::size(&fixed_iv);
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          if (pSVar5->variable_nonce_len_ < sVar4) {
            __assert_fail("fixed_iv.size() <= aead_ctx->variable_nonce_len_",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                          ,0x55,
                          "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                         );
          }
          if (((ulong)aead->cleanup & 0x1800000000) == 0) {
            __assert_fail("cipher->algorithm_enc & (SSL_AES128GCM | SSL_AES256GCM)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                          ,0x56,
                          "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                         );
          }
          sVar4 = Span<const_unsigned_char>::size(&fixed_iv);
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          pSVar5->variable_nonce_len_ = pSVar5->variable_nonce_len_ - (char)sVar4;
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          pSVar5->field_0x26a = pSVar5->field_0x26a & 0xfe | 1;
        }
        else {
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          pSVar5->field_0x26a = pSVar5->field_0x26a | 4;
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          pSVar5->variable_nonce_len_ = '\b';
          sVar4 = Span<const_unsigned_char>::size(&fixed_iv);
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          if (sVar4 < pSVar5->variable_nonce_len_) {
            __assert_fail("fixed_iv.size() >= aead_ctx->variable_nonce_len_",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                          ,0x52,
                          "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                         );
          }
        }
        if (0x303 < expected_mac_key_len._6_2_) {
          pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                             (&local_58);
          pSVar5->field_0x26a = pSVar5->field_0x26a & 0xef | 0x10;
        }
      }
      else {
        if (0x303 < expected_mac_key_len._6_2_) {
          __assert_fail("protocol_version < TLS1_3_VERSION",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                        ,99,
                        "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                       );
        }
        sVar4 = Span<const_unsigned_char>::size(&mac_key);
        sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_20);
        sVar7 = Span<const_unsigned_char>::size(&fixed_iv);
        if (0x50 < sVar4 + sVar6 + sVar7) {
          abort();
        }
        puVar8 = Span<const_unsigned_char>::data(&mac_key);
        sVar4 = Span<const_unsigned_char>::size(&mac_key);
        ::OPENSSL_memcpy(local_b8,puVar8,sVar4);
        sVar4 = Span<const_unsigned_char>::size(&mac_key);
        puVar8 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)auStack_20);
        sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_20);
        ::OPENSSL_memcpy(local_b8 + sVar4,puVar8,sVar6);
        sVar4 = Span<const_unsigned_char>::size(&mac_key);
        sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_20);
        puVar8 = Span<const_unsigned_char>::data(&fixed_iv);
        sVar7 = Span<const_unsigned_char>::size(&fixed_iv);
        ::OPENSSL_memcpy(local_b8 + sVar6 + sVar4,puVar8,sVar7);
        sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_20);
        sVar6 = Span<const_unsigned_char>::size(&mac_key);
        sVar7 = Span<const_unsigned_char>::size(&fixed_iv);
        Span<unsigned_char>::Span(&local_f8,local_b8,sVar4 + sVar6 + sVar7);
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_e8,&local_f8);
        _auStack_20 = local_e8;
        enc_key_local.data_ = local_e0;
        pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&local_58);
        pSVar5->field_0x26a = pSVar5->field_0x26a & 0xfe | 1;
        pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&local_58);
        pSVar5->field_0x26a = pSVar5->field_0x26a & 0xfd | 2;
        pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&local_58);
        pSVar5->field_0x26a = pSVar5->field_0x26a & 0xf7 | 8;
      }
      pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->(&local_58)
      ;
      ctx = internal::
            StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::get
                      (&pSVar5->ctx_);
      puVar8 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)auStack_20);
      sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_20);
      iVar2 = EVP_AEAD_CTX_init_with_direction(ctx,pEStack_38,puVar8,sVar4,0,cipher_local._4_4_);
      if (iVar2 == 0) {
        std::unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter> *)
                   this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,(nullptr_t)0x0)
        ;
      }
      else {
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                   this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,&local_58);
      }
    }
    else {
      std::unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter> *)
                 this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,(nullptr_t)0x0);
    }
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                  ,0x3a);
    std::unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter> *)
               this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
         (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
         this.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
}

Assistant:

UniquePtr<SSLAEADContext> SSLAEADContext::Create(
    enum evp_aead_direction_t direction, uint16_t version,
    const SSL_CIPHER *cipher, Span<const uint8_t> enc_key,
    Span<const uint8_t> mac_key, Span<const uint8_t> fixed_iv) {
  const EVP_AEAD *aead;
  uint16_t protocol_version;
  size_t expected_mac_key_len, expected_fixed_iv_len;
  if (!ssl_protocol_version_from_wire(&protocol_version, version) ||
      !ssl_cipher_get_evp_aead(&aead, &expected_mac_key_len,
                               &expected_fixed_iv_len, cipher,
                               protocol_version) ||
      // Ensure the caller returned correct key sizes.
      expected_fixed_iv_len != fixed_iv.size() ||
      expected_mac_key_len != mac_key.size()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return nullptr;
  }

  UniquePtr<SSLAEADContext> aead_ctx = MakeUnique<SSLAEADContext>(cipher);
  if (!aead_ctx) {
    return nullptr;
  }

  uint8_t merged_key[EVP_AEAD_MAX_KEY_LENGTH];
  assert(EVP_AEAD_nonce_length(aead) <= EVP_AEAD_MAX_NONCE_LENGTH);
  static_assert(EVP_AEAD_MAX_NONCE_LENGTH < 256,
                "variable_nonce_len doesn't fit in uint8_t");
  aead_ctx->variable_nonce_len_ = (uint8_t)EVP_AEAD_nonce_length(aead);
  if (mac_key.empty()) {
    // This is an actual AEAD.
    aead_ctx->fixed_nonce_.CopyFrom(fixed_iv);

    if (protocol_version >= TLS1_3_VERSION ||
        cipher->algorithm_enc & SSL_CHACHA20POLY1305) {
      // TLS 1.3, and TLS 1.2 ChaCha20-Poly1305, XOR the fixed IV with the
      // sequence number to form the nonce.
      aead_ctx->xor_fixed_nonce_ = true;
      aead_ctx->variable_nonce_len_ = 8;
      assert(fixed_iv.size() >= aead_ctx->variable_nonce_len_);
    } else {
      // TLS 1.2 AES-GCM prepends the fixed IV to an explicit nonce.
      assert(fixed_iv.size() <= aead_ctx->variable_nonce_len_);
      assert(cipher->algorithm_enc & (SSL_AES128GCM | SSL_AES256GCM));
      aead_ctx->variable_nonce_len_ -= fixed_iv.size();
      aead_ctx->variable_nonce_included_in_record_ = true;
    }

    // Starting TLS 1.3, the AAD is the whole record header.
    if (protocol_version >= TLS1_3_VERSION) {
      aead_ctx->ad_is_header_ = true;
    }
  } else {
    // This is a CBC cipher suite that implements the |EVP_AEAD| interface. The
    // |EVP_AEAD| takes the MAC key, encryption key, and fixed IV concatenated
    // as its input key.
    assert(protocol_version < TLS1_3_VERSION);
    BSSL_CHECK(mac_key.size() + enc_key.size() + fixed_iv.size() <=
               sizeof(merged_key));
    OPENSSL_memcpy(merged_key, mac_key.data(), mac_key.size());
    OPENSSL_memcpy(merged_key + mac_key.size(), enc_key.data(), enc_key.size());
    OPENSSL_memcpy(merged_key + mac_key.size() + enc_key.size(),
                   fixed_iv.data(), fixed_iv.size());
    enc_key =
        Span(merged_key, enc_key.size() + mac_key.size() + fixed_iv.size());

    // The |EVP_AEAD|'s per-encryption nonce, if any, is actually the CBC IV. It
    // must be generated randomly and prepended to the record.
    aead_ctx->variable_nonce_included_in_record_ = true;
    aead_ctx->random_variable_nonce_ = true;
    aead_ctx->omit_length_in_ad_ = true;
  }

  if (!EVP_AEAD_CTX_init_with_direction(
          aead_ctx->ctx_.get(), aead, enc_key.data(), enc_key.size(),
          EVP_AEAD_DEFAULT_TAG_LENGTH, direction)) {
    return nullptr;
  }

  return aead_ctx;
}